

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding_test.cc
# Opt level: O1

void leveldb::_Test_Varint32::_RunIt(void)

{
  char cVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  uint uVar4;
  char *limit;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_210;
  uint uStack_204;
  string sStack_200;
  int iStack_1e0;
  uint uStack_1dc;
  char *pcStack_1d8;
  Tester TStack_1d0;
  
  sStack_200._M_dataplus._M_p = (pointer)&sStack_200.field_2;
  sStack_200._M_string_length = 0;
  sStack_200.field_2._M_local_buf[0] = '\0';
  uVar4 = 0;
  do {
    PutVarint32(&sStack_200,(uVar4 >> 5) << ((byte)uVar4 & 0x1f));
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x400);
  paStack_210 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sStack_200._M_dataplus._M_p;
  limit = sStack_200._M_dataplus._M_p + sStack_200._M_string_length;
  uVar4 = 0;
  do {
    paVar2 = paStack_210;
    uStack_1dc = (uVar4 >> 5) << ((byte)uVar4 & 0x1f);
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(ulong)uStack_1dc;
    if (paStack_210 < limit) {
      cVar1 = paStack_210->_M_local_buf[0];
      if (-1 < cVar1) {
        paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(paStack_210->_M_local_buf + 1);
        uStack_204 = (int)cVar1;
      }
      if (cVar1 < '\0') goto LAB_001058d5;
    }
    else {
LAB_001058d5:
      paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)GetVarint32PtrFallback(paStack_210->_M_local_buf,limit,&uStack_204);
    }
    TStack_1d0.ok_ = true;
    TStack_1d0.fname_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
    ;
    TStack_1d0.line_ = 0x5c;
    paStack_210 = paVar3;
    std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1d0.ss_);
    test::Tester::Is(&TStack_1d0,
                     paStack_210 !=
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0,"p != nullptr");
    test::Tester::~Tester(&TStack_1d0);
    TStack_1d0.ok_ = true;
    TStack_1d0.fname_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
    ;
    TStack_1d0.line_ = 0x5d;
    std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1d0.ss_);
    test::Tester::IsEq<unsigned_int,unsigned_int>(&TStack_1d0,&uStack_1dc,&uStack_204);
    test::Tester::~Tester(&TStack_1d0);
    TStack_1d0.ok_ = true;
    TStack_1d0.fname_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
    ;
    TStack_1d0.line_ = 0x5e;
    std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1d0.ss_);
    iStack_1e0 = VarintLength((ulong)uStack_204);
    pcStack_1d8 = paStack_210->_M_local_buf + -(long)paVar2;
    test::Tester::IsEq<int,long>(&TStack_1d0,&iStack_1e0,(long *)&pcStack_1d8);
    test::Tester::~Tester(&TStack_1d0);
    uVar4 = uVar4 + 1;
    if (uVar4 == 0x400) {
      TStack_1d0.ok_ = true;
      TStack_1d0.fname_ =
           "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
      ;
      TStack_1d0.line_ = 0x60;
      std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1d0.ss_);
      pcStack_1d8 = sStack_200._M_dataplus._M_p + sStack_200._M_string_length;
      test::Tester::IsEq<char_const*,char_const*>(&TStack_1d0,(char **)&paStack_210,&pcStack_1d8);
      test::Tester::~Tester(&TStack_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_200._M_dataplus._M_p != &sStack_200.field_2) {
        operator_delete(sStack_200._M_dataplus._M_p);
      }
      return;
    }
  } while( true );
}

Assistant:

TEST(Coding, Varint32) {
  std::string s;
  for (uint32_t i = 0; i < (32 * 32); i++) {
    uint32_t v = (i / 32) << (i % 32);
    PutVarint32(&s, v);
  }

  const char* p = s.data();
  const char* limit = p + s.size();
  for (uint32_t i = 0; i < (32 * 32); i++) {
    uint32_t expected = (i / 32) << (i % 32);
    uint32_t actual;
    const char* start = p;
    p = GetVarint32Ptr(p, limit, &actual);
    ASSERT_TRUE(p != nullptr);
    ASSERT_EQ(expected, actual);
    ASSERT_EQ(VarintLength(actual), p - start);
  }
  ASSERT_EQ(p, s.data() + s.size());
}